

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall
chrono::ChParticleCloud::IntStateGather
          (ChParticleCloud *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  double *pdVar1;
  ChAparticle *pCVar2;
  int iVar3;
  pointer ppCVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint local_6c;
  double local_48 [3];
  
  ppCVar4 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    uVar10 = off_x + 3;
    uVar11 = off_v + 3;
    uVar6 = 0;
    uVar9 = (ulong)off_x;
    local_6c = off_v;
    do {
      iVar3 = (int)uVar6;
      uVar5 = iVar3 * 7 + off_x;
      if ((x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)uVar5) {
LAB_005377c2:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar1 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar7 = 3;
      if ((((ulong)(pdVar1 + uVar5) & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)(pdVar1 + uVar5) >> 3) & 0x1fffffff) & 7), 2 < uVar7)) {
        uVar7 = 3;
      }
      pCVar2 = ppCVar4[uVar6];
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          pdVar1[uVar9 + uVar8] =
               (pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               coord.pos.m_data[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (uVar7 < 3) {
        do {
          pdVar1[uVar9 + uVar7] =
               (pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               coord.pos.m_data[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      if ((x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -4 <
          (long)(ulong)(uVar5 + 3)) goto LAB_005377c2;
      pdVar1 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar7 = 4;
      if ((((ulong)(pdVar1 + (uVar5 + 3)) & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)(pdVar1 + (uVar5 + 3)) >> 3) & 0x1fffffff) & 7), 3 < uVar7
         )) {
        uVar7 = 4;
      }
      pCVar2 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          pdVar1[uVar10 + uVar8] =
               *(double *)
                ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                        super_ChFrame<double> + uVar8 * 8 + 0x20);
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (uVar7 < 4) {
        do {
          pdVar1[uVar10 + uVar7] =
               *(double *)
                ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                        super_ChFrame<double> + uVar7 * 8 + 0x20);
          uVar7 = uVar7 + 1;
        } while (uVar7 != 4);
      }
      uVar5 = off_v + iVar3 * 6;
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)uVar5) goto LAB_005377c2;
      pdVar1 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar7 = 3;
      if ((((ulong)(pdVar1 + uVar5) & 7) == 0) &&
         (uVar7 = (ulong)(-((uint)((ulong)(pdVar1 + uVar5) >> 3) & 0x1fffffff) & 7), 2 < uVar7)) {
        uVar7 = 3;
      }
      pCVar2 = (this->particles).
               super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          pdVar1[local_6c + uVar8] =
               *(double *)
                ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt +
                uVar8 * 8);
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (uVar7 < 3) {
        do {
          pdVar1[local_6c + uVar7] =
               *(double *)
                ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt +
                uVar7 * 8);
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      ChFrameMoving<double>::GetWvel_loc
                ((ChFrameMoving<double> *)
                 (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6]);
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)(uVar5 + 3)) goto LAB_005377c2;
      pdVar1 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar6 = 3;
      if ((((ulong)(pdVar1 + (uVar5 + 3)) & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)(pdVar1 + (uVar5 + 3)) >> 3) & 0x1fffffff) & 7), 2 < uVar6
         )) {
        uVar6 = 3;
      }
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          pdVar1[uVar11 + uVar7] = local_48[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      if (uVar6 < 3) {
        do {
          pdVar1[uVar11 + uVar6] = local_48[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
      }
      *T = (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj.ChTime;
      uVar6 = (ulong)(iVar3 + 1);
      ppCVar4 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (ulong)((int)uVar9 + 7);
      uVar10 = uVar10 + 7;
      local_6c = local_6c + 6;
      uVar11 = uVar11 + 6;
    } while (uVar6 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3))
    ;
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                       ChState& x,                // state vector, position part
                                       const unsigned int off_v,  // offset in v state vector
                                       ChStateDelta& v,           // state vector, speed part
                                       double& T                  // time
) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        x.segment(off_x + 7 * j + 0, 3) = particles[j]->coord.pos.eigen();
        x.segment(off_x + 7 * j + 3, 4) = particles[j]->coord.rot.eigen();

        v.segment(off_v + 6 * j + 0, 3) = particles[j]->coord_dt.pos.eigen();
        v.segment(off_v + 6 * j + 3, 3) = particles[j]->GetWvel_loc().eigen();

        T = GetChTime();
    }
}